

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O0

void __thiscall FCycler::FCycler(FCycler *this)

{
  FCycler *this_local;
  
  this->m_cycle = 0.0;
  this->m_cycleType = CYCLE_Linear;
  this->m_shouldCycle = false;
  this->m_current = 0.0;
  this->m_start = 0.0;
  this->m_end = 0.0;
  this->m_increment = true;
  return;
}

Assistant:

FCycler::FCycler()
{
	m_cycle = 0.f;
	m_cycleType = CYCLE_Linear;
	m_shouldCycle = false;
	m_start = m_current = 0.f;
	m_end = 0.f;
	m_increment = true;
}